

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::sendBrokerErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  ushort uVar1;
  GlobalFederateId fedid;
  uint uVar2;
  bool bVar3;
  route_id rVar4;
  string *psVar5;
  char *pcVar6;
  string_view str;
  string_view name;
  size_t sStack_f0;
  ActionMessage badInit;
  
  fedid.gid = (command->source_id).gid;
  if (((fedid.gid == -2010000000) || (fedid.gid == 0)) || (fedid.gid == -1700000000)) {
    uVar1 = command->flags;
    uVar2 = this->routeCount;
    this->routeCount = uVar2 + 1;
    rVar4.rid = uVar2 + 0xa000000;
    if ((uVar1 & 0x40) == 0) {
      rVar4.rid = uVar2;
    }
    uVar2 = (command->dest_handle).hid;
    psVar5 = ActionMessage::getString_abi_cxx11_(command,0);
    (*(this->super_Broker)._vptr_Broker[0x24])
              (this,(ulong)(uint)rVar4.rid,(ulong)uVar2,psVar5->_M_string_length,
               (psVar5->_M_dataplus)._M_p);
    bVar3 = true;
  }
  else {
    rVar4 = getRoute(this,fedid);
    bVar3 = false;
  }
  ActionMessage::ActionMessage(&badInit,cmd_broker_ack);
  badInit.flags._0_1_ = (byte)badInit.flags | 0x10;
  badInit.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  name._M_str = (char *)(command->payload).heap;
  name._M_len = (command->payload).bufferSize;
  ActionMessage::name(&badInit,name);
  badInit.messageID = errorCode;
  if (errorCode == 9) {
    pcVar6 = "broker key does not match";
    sStack_f0 = 0x19;
  }
  else {
    if (errorCode != 0xe) goto LAB_002c9280;
    pcVar6 = "broker is terminating";
    sStack_f0 = 0x15;
  }
  str._M_str = pcVar6;
  str._M_len = sStack_f0;
  ActionMessage::setString(&badInit,0,str);
LAB_002c9280:
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar4.rid,&badInit);
  if (bVar3) {
    (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)rVar4.rid);
  }
  ActionMessage::~ActionMessage(&badInit);
  return;
}

Assistant:

void CoreBroker::sendBrokerErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    route_id newroute;
    bool route_created = false;
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
        route_created = true;
    } else {
        newroute = getRoute(command.source_id);
    }
    ActionMessage badInit(CMD_BROKER_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.name(command.name());
    badInit.messageID = errorCode;
    switch (errorCode) {
        case broker_terminating:
            badInit.setString(0, "broker is terminating");
            break;
        case mismatch_broker_key_error_code:
            badInit.setString(0, "broker key does not match");
            break;
        default:
            break;
    }
    transmit(newroute, badInit);

    if (route_created) {
        removeRoute(newroute);
    }
}